

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O2

bool __thiscall raptor::TcpServer::CloseConnection(TcpServer *this,ConnectionId cid)

{
  uint32_t index;
  shared_ptr<raptor::Connection> con;
  IAcceptor local_28;
  
  index = CheckConnectionId(this,cid);
  if (index != 0xffffffff) {
    GetConnection((TcpServer *)&stack0xffffffffffffffd8,(uint32_t)this);
    if ((Connection *)local_28._vptr_IAcceptor != (Connection *)0x0) {
      Connection::Shutdown((Connection *)local_28._vptr_IAcceptor,false);
      DeleteConnection(this,index);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  }
  return index != 0xffffffff;
}

Assistant:

bool TcpServer::CloseConnection(ConnectionId cid){
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        return false;
    }

    auto con = GetConnection(index);
    if (con) {
        con->Shutdown(false);
        DeleteConnection(index);
    }
    return true;
}